

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O1

UBool __thiscall icu_63::UVector::containsNone(UVector *this,UVector *other)

{
  int32_t iVar1;
  bool bVar2;
  long lVar3;
  
  bVar2 = other->count < 1;
  if ((0 < other->count) && (iVar1 = indexOf(this,*other->elements,0,'\0'), iVar1 < 0)) {
    lVar3 = 1;
    do {
      bVar2 = other->count <= lVar3;
      if (other->count <= lVar3) {
        return bVar2;
      }
      iVar1 = indexOf(this,other->elements[lVar3],0,'\0');
      lVar3 = lVar3 + 1;
    } while (iVar1 < 0);
  }
  return bVar2;
}

Assistant:

UBool UVector::containsNone(const UVector& other) const {
    for (int32_t i=0; i<other.size(); ++i) {
        if (indexOf(other.elements[i]) >= 0) {
            return FALSE;
        }
    }
    return TRUE;
}